

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateCompileFunc(jx9_gen_state *pGen,SyString *pName,sxi32 iFlags,jx9_vm_func **ppFunc)

{
  SyHash *pHash;
  SyToken *pSVar1;
  uint uVar2;
  jx9_vm *pjVar3;
  SySet *pSVar4;
  sxi32 sVar5;
  sxi32 sVar6;
  uint uVar7;
  SySet *pSet;
  SyMemBackend *pSVar8;
  GenBlock *pGVar9;
  SyHashEntry_Pr *pSVar10;
  int iVar11;
  ulong uVar12;
  SySet *pSVar13;
  char *zFormat;
  sxu32 sVar14;
  undefined4 in_register_00000014;
  SyToken *pCur;
  SyToken *pSVar15;
  SyToken *pSVar16;
  SyToken *pSVar17;
  bool bVar18;
  jx9_vm_func_arg sArg;
  SyBlob sSig;
  undefined4 local_c4;
  uint local_c0;
  int local_bc;
  GenBlock *local_b8;
  undefined8 uStack_b0;
  SySet local_a8;
  undefined8 uStack_80;
  SySet *local_78;
  undefined8 *local_70;
  SyToken *local_68;
  SyToken *pSStack_60;
  SyBlob local_50;
  
  local_70 = (undefined8 *)CONCAT44(in_register_00000014,iFlags);
  pSVar16 = pGen->pEnd;
  sVar14 = pGen->pIn->nLine;
  pSVar15 = pGen->pIn + 1;
  pGen->pIn = pSVar15;
  if (pSVar15 < pSVar16) {
    iVar11 = 1;
    do {
      if ((pSVar15->nType >> 9 & 1) == 0) {
        if ((pSVar15->nType >> 10 & 1) != 0) {
          if (iVar11 < 2) break;
          iVar11 = iVar11 + -1;
        }
      }
      else {
        iVar11 = iVar11 + 1;
      }
      pSVar15 = pSVar15 + 1;
    } while (pSVar15 < pSVar16);
  }
  if (pSVar15 < pSVar16) {
    pSet = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0xb0);
    if ((pSet == (SySet *)0x0) ||
       (pSVar8 = (SyMemBackend *)
                 SyMemBackendStrDup(&pGen->pVm->sAllocator,pName->zString,pName->nByte),
       pSVar8 == (SyMemBackend *)0x0)) {
      jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
      sVar6 = -10;
    }
    else {
      pjVar3 = pGen->pVm;
      local_c0 = pName->nByte;
      memset(pSet,0,0xb0);
      pSet->eSize = 0x40;
      pSet->nCursor = 0;
      pSet->pAllocator = &pjVar3->sAllocator;
      pSet->pBase = (void *)0x0;
      pSet->nUsed = 0;
      pSet->nSize = 0;
      pSet->pUserData = (void *)0x0;
      pSet[1].eSize = 0x40;
      pSet[1].nCursor = 0;
      pSet[1].pAllocator = &pjVar3->sAllocator;
      pSet[1].pBase = (void *)0x0;
      pSet[1].nUsed = 0;
      pSet[1].nSize = 0;
      pSet[1].pUserData = (void *)0x0;
      local_78 = (SySet *)&pSet[2].nUsed;
      pSet[3].pAllocator = (SyMemBackend *)0x18;
      *(jx9_vm **)&pSet[2].nUsed = pjVar3;
      pSet[2].eSize = 0;
      pSet[2].nCursor = 0;
      pSet[2].pUserData = (void *)0x0;
      pSet[3].pBase = (void *)0x0;
      SySetAlloc(local_78,0x10);
      pSet[3].nUsed = 0;
      pSet[4].pAllocator = (SyMemBackend *)0x0;
      pSet[2].pAllocator = pSVar8;
      *(uint *)&pSet[2].pBase = local_c0;
      pSVar16 = pGen->pIn;
      if (pSVar16 < pSVar15) {
        local_50.pAllocator = &pGen->pVm->sAllocator;
        local_50.pBlob = (void *)0x0;
        local_50.nByte = 0;
        local_50.mByte = 0;
        local_50.nFlags = 0;
        do {
          uStack_80 = 0;
          local_b8 = (GenBlock *)0x0;
          uStack_b0 = 0;
          local_a8.pAllocator = &pGen->pVm->sAllocator;
          local_a8.nSize = 0;
          local_a8.eSize = 0x18;
          local_a8.nUsed = 0;
          local_a8.nCursor = 0;
          local_a8.pBase = (void *)0x0;
          local_a8.pUserData = (void *)0x0;
          if ((pSVar16->nType & 0xc) != 0) {
            if ((pSVar16->nType & 4) != 0) {
              if ((short)pSVar16->pUserData < 0) {
                uStack_80 = 8;
              }
              else {
                uVar7 = (uint)pSVar16->pUserData;
                if ((uVar7 >> 0x10 & 1) == 0) {
                  if ((uVar7 >> 0x12 & 1) == 0) {
                    if ((uVar7 >> 0x11 & 1) == 0) {
                      jx9GenCompileError(pGen,2,pGen->pIn->nLine,
                                         "Invalid argument type \'%z\', Automatic cast will not be performed"
                                        );
                    }
                    else {
                      uStack_80 = 4;
                    }
                  }
                  else {
                    uStack_80 = 1;
                  }
                }
                else {
                  uStack_80 = 2;
                }
              }
            }
            pSVar16 = pSVar16 + 1;
          }
          if (pSVar15 <= pSVar16) {
            sVar14 = pGen->pIn->nLine;
            zFormat = "Missing argument name";
LAB_001284db:
            uVar7 = jx9GenCompileError(pGen,1,sVar14,zFormat);
            goto LAB_001284ec;
          }
          if ((((pSVar16->nType & 0x10) == 0) || (pSVar15 <= pSVar16 + 1)) ||
             ((pSVar16[1].nType & 0xc) == 0)) {
            sVar14 = pGen->pIn->nLine;
            zFormat = "Invalid argument name";
            goto LAB_001284db;
          }
          pGVar9 = (GenBlock *)
                   SyMemBackendStrDup(&pGen->pVm->sAllocator,pSVar16[1].sData.zString,
                                      pSVar16[1].sData.nByte);
          if (pGVar9 == (GenBlock *)0x0) {
            jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
            uVar7 = 0xfffffff6;
            goto LAB_001284ec;
          }
          uStack_b0 = CONCAT44(uStack_b0._4_4_,pSVar16[1].sData.nByte);
          pSVar17 = pSVar16 + 2;
          local_b8 = pGVar9;
          if (pSVar17 < pSVar15) {
            uVar7 = local_c0;
            if ((pSVar16[2].nType & 0x400000) != 0) {
              pSVar1 = pSVar16 + 3;
              uVar7 = 0;
              pSVar17 = pSVar1;
              if (pSVar1 < pSVar15) {
                uVar12 = 0x60;
                do {
                  uVar2 = pSVar17->nType;
                  if (((uVar2 >> 0x11 & 1) != 0) && ((int)uVar7 < 1)) break;
                  iVar11 = -(uint)((uVar2 & 0x1480) != 0);
                  if ((uVar2 & 0xa40) != 0) {
                    iVar11 = 1;
                  }
                  uVar7 = uVar7 + iVar11;
                  uVar12 = uVar12 + 0x20;
                  pSVar17 = pSVar17 + 1;
                } while (pSVar17 < pSVar15);
                uVar7 = (uint)(0x60 < uVar12);
              }
              if ((char)uVar7 == '\0') {
                bVar18 = false;
                uVar7 = jx9GenCompileError(pGen,1,pSVar16[3].nLine,"Missing argument default value")
                ;
                pSVar17 = pSVar1;
              }
              else {
                local_68 = pGen->pIn;
                pSStack_60 = pGen->pEnd;
                pGen->pIn = pSVar1;
                pGen->pEnd = pSVar17;
                pSVar4 = pGen->pVm->pByteContainer;
                pGen->pVm->pByteContainer = &local_a8;
                local_bc = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)
                                                 0x0);
                jx9VmEmitInstr(pGen->pVm,1,(uint)(local_bc != -3),0,(void *)0x0,(sxu32 *)0x0);
                pSVar13 = &pGen->pVm->aByteCode;
                if (pSVar4 != (SySet *)0x0) {
                  pSVar13 = pSVar4;
                }
                pGen->pVm->pByteContainer = pSVar13;
                pGen->pIn = local_68;
                pGen->pEnd = pSStack_60;
                bVar18 = local_bc != -10;
                uVar7 = local_c0;
                if (!bVar18) {
                  pSVar17 = pSVar1;
                  uVar7 = 0xfffffff6;
                }
              }
              if (!bVar18) goto LAB_001284ec;
            }
            if ((pSVar17 < pSVar15) && ((pSVar17->nType & 0x20000) == 0)) {
              uVar7 = jx9GenCompileError(pGen,1,pSVar17->nLine,"Unexpected token \'%z\'",pSVar17);
              goto LAB_001284ec;
            }
            pSVar17 = pSVar17 + 1;
            local_c0 = uVar7;
          }
          pSVar16 = pSVar17;
          if ((int)uStack_80 != 0) {
            local_c4 = 0x6e;
            switch((int)uStack_80) {
            case 1:
              local_c4 = 0x73;
              break;
            case 2:
              local_c4 = 0x69;
              break;
            case 3:
            case 5:
            case 6:
            case 7:
              break;
            case 4:
              local_c4 = 0x66;
              break;
            case 8:
              local_c4 = 0x62;
              break;
            default:
              if ((int)uStack_80 == 0x40) {
                local_c4 = 0x68;
              }
            }
            SyBlobAppend(&local_50,&local_c4,1);
          }
          SySetPut(pSet,&local_b8);
        } while (pSVar16 < pSVar15);
        uVar7 = 0;
        if (local_50.nByte != 0) {
          *(void **)&pSet[3].eSize = local_50.pBlob;
          uVar7 = 0;
          *(sxu32 *)&pSet[3].pUserData = local_50.nByte;
        }
LAB_001284ec:
        if (uVar7 == 0xfffffff6) {
          return -10;
        }
      }
      pGen->pIn = pSVar15 + 1;
      sVar5 = GenStateEnterBlock(pGen,10,pGen->pVm->pByteContainer->nUsed,pSet,&local_b8);
      if (sVar5 == 0) {
        pSVar4 = pGen->pVm->pByteContainer;
        pGen->pVm->pByteContainer = local_78;
        jx9CompileBlock(pGen);
        jx9VmEmitInstr(pGen->pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
        pSVar13 = &pGen->pVm->aByteCode;
        if (pSVar4 != (SySet *)0x0) {
          pSVar13 = pSVar4;
        }
        pGen->pVm->pByteContainer = pSVar13;
        pGVar9 = pGen->pCurrent;
        if (pGVar9 != (GenBlock *)0x0) {
          pGen->pCurrent = pGVar9->pParent;
          GenStateFreeBlock(pGVar9);
        }
      }
      else {
        jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
      }
      sVar6 = -10;
      if (sVar5 == 0) {
        if (local_70 != (undefined8 *)0x0) {
          *local_70 = pSet;
        }
        pHash = &pGen->pVm->hFunction;
        pSVar10 = (SyHashEntry_Pr *)0x0;
        if ((*(sxu32 *)&pSet[2].pBase != 0) && ((pGen->pVm->hFunction).nEntry != 0)) {
          pSVar10 = HashGetEntry(pHash,pSet[2].pAllocator,*(sxu32 *)&pSet[2].pBase);
        }
        if (pSVar10 == (SyHashEntry_Pr *)0x0) {
          pSet[4].pBase = (void *)0x0;
          sVar6 = SyHashInsert(pHash,pSet[2].pAllocator,*(sxu32 *)&pSet[2].pBase,pSet);
        }
        else {
          sVar6 = 0;
          if ((SySet *)pSVar10->pUserData != pSet) {
            pSet[4].pBase = (SySet *)pSVar10->pUserData;
            pSVar10->pUserData = pSet;
          }
        }
      }
    }
  }
  else {
    sVar5 = jx9GenCompileError(pGen,1,sVar14,"Missing \')\' after function \'%z\' signature",pName);
    sVar6 = -10;
    if (sVar5 != -10) {
      pGen->pIn = pGen->pEnd;
      sVar6 = 0;
    }
  }
  return sVar6;
}

Assistant:

static sxi32 GenStateCompileFunc(
	jx9_gen_state *pGen, /* Code generator state */
	SyString *pName,     /* Function name. NULL otherwise */
	sxi32 iFlags,        /* Control flags */
	jx9_vm_func **ppFunc /* OUT: function state */
	)
{
	jx9_vm_func *pFunc;
	SyToken *pEnd;
	sxu32 nLine;
	char *zName;
	sxi32 rc;
	/* Extract line number */
	nLine = pGen->pIn->nLine;
	/* Jump the left parenthesis '(' */
	pGen->pIn++;
	/* Delimit the function signature */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pEnd >= pGen->pEnd ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Missing ')' after function '%z' signature", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		pGen->pIn = pGen->pEnd;
		return SXRET_OK;
	}
	/* Create the function state */
	pFunc = (jx9_vm_func *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(jx9_vm_func));
	if( pFunc == 0 ){
		goto OutOfMem;
	}
	/* function ID */
	zName = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
	if( zName == 0 ){
		/* Don't worry about freeing memory, everything will be released shortly */
		goto OutOfMem;
	}
	/* Initialize the function state */
	jx9VmInitFuncState(pGen->pVm, pFunc, zName, pName->nByte, iFlags, 0);
	if( pGen->pIn < pEnd ){
		/* Collect function arguments */
		rc = GenStateCollectFuncArgs(pFunc, &(*pGen), pEnd);
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
	}
	/* Compile function body */
	pGen->pIn = &pEnd[1];
	/* Compile the body */
	rc = GenStateCompileFuncBody(&(*pGen), pFunc);
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	if( ppFunc ){
		*ppFunc = pFunc;
	}
	/* Finally register the function */
	rc = jx9VmInstallUserFunction(pGen->pVm, pFunc, 0);
	return rc;
	/* Fall through if something goes wrong */
OutOfMem:
	/* If the supplied memory subsystem is so sick that we are unable to allocate
	 * a tiny chunk of memory, there is no much we can do here.
	 */
	return GenStateOutOfMem(pGen);
}